

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O1

apx_error_t apx_nodeInstance_vfile_open_notify(void *arg,apx_file_t *file)

{
  apx_fileType_t aVar1;
  uint32_t address;
  apx_size_t aVar2;
  uint uVar3;
  apx_fileManager_tag *file_manager;
  uint8_t *puVar4;
  
  if (arg == (void *)0x0 || file == (apx_file_t *)0x0) {
    return 0x24;
  }
  if (*(long *)((long)arg + 0x50) == 0) {
    return 0x24;
  }
  file_manager = apx_file_get_file_manager(file);
  if (file_manager == (apx_fileManager_tag *)0x0) goto LAB_0012eb3b;
  aVar1 = apx_file_get_apx_file_type(file);
  address = apx_file_get_address_without_flags(file);
  if (aVar1 == '\x03') {
    file = (apx_file_t *)0x0;
    if (*(char *)((long)arg + 0x78) != '\x02') goto LAB_0012eb3b;
    if (*(apx_server_t **)((long)arg + 0x88) != (apx_server_t *)0x0) {
      apx_server_take_global_lock(*(apx_server_t **)((long)arg + 0x88));
      uVar3 = connect_require_ports_to_server((apx_nodeInstance_t *)arg);
      if (uVar3 == 0) {
        *(undefined1 *)((long)arg + 0x7a) = 4;
        uVar3 = send_require_port_data_to_file_manager
                          ((apx_nodeInstance_t *)arg,file_manager,address);
      }
      file = (apx_file_t *)(ulong)uVar3;
      apx_server_release_global_lock(*(apx_server_t **)((long)arg + 0x88));
      goto LAB_0012eb3b;
    }
    *(undefined1 *)((long)arg + 0x7a) = 4;
    uVar3 = send_require_port_data_to_file_manager((apx_nodeInstance_t *)arg,file_manager,address);
  }
  else if (aVar1 == '\x02') {
    puVar4 = apx_nodeData_take_provide_port_data_snapshot(*(apx_nodeData_t **)((long)arg + 0x50));
    aVar2 = apx_nodeData_provide_port_data_size(*(apx_nodeData_t **)((long)arg + 0x50));
    if (puVar4 == (uint8_t *)0x0) {
      file = (apx_file_t *)0x2;
      goto LAB_0012eb3b;
    }
    uVar3 = apx_fileManager_send_local_data(file_manager,address,puVar4,aVar2);
  }
  else {
    file = (apx_file_t *)0xa;
    if (aVar1 != '\x01') goto LAB_0012eb3b;
    puVar4 = apx_nodeData_get_definition_data(*(apx_nodeData_t **)((long)arg + 0x50));
    aVar2 = apx_nodeData_definition_data_size(*(apx_nodeData_t **)((long)arg + 0x50));
    uVar3 = apx_fileManager_send_local_const_data(file_manager,address,puVar4,aVar2);
  }
  file = (apx_file_t *)(ulong)uVar3;
LAB_0012eb3b:
  if (file_manager == (apx_fileManager_tag *)0x0) {
    return 0x24;
  }
  return (apx_error_t)file;
}

Assistant:

static apx_error_t file_open_notify(apx_nodeInstance_t* self, apx_file_t* file)
{
   if ( (file != NULL) && (self != NULL) && (self->node_data != NULL) )
   {
      apx_fileManager_t* file_manager = apx_file_get_file_manager(file);
      if (file_manager != NULL)
      {
         apx_error_t retval = APX_NO_ERROR;
         apx_fileType_t file_type = apx_file_get_apx_file_type(file);
         uint32_t address = apx_file_get_address_without_flags(file);
         switch (file_type)
         {
         case APX_DEFINITION_FILE_TYPE:
            retval = send_definition_data_to_file_manager(self, file_manager, address);
            break;
         case APX_PROVIDE_PORT_DATA_FILE_TYPE:
            retval = send_provide_port_data_to_file_manager(self, file_manager, address);
            break;
         case APX_REQUIRE_PORT_DATA_FILE_TYPE:
            if (self->mode == APX_SERVER_MODE)
            {
               if (self->server != NULL)
               {
                  apx_server_take_global_lock(self->server);
                  retval = connect_require_ports_to_server(self);
                  if (retval == APX_NO_ERROR)
                  {
                     apx_nodeInstance_set_require_port_data_state(self, APX_DATA_STATE_CONNECTED);
                     //TODO:Take snapshot first, then release global lock, then transmit snapshot data through file manager.
                     //This shortens the time the global lock is held.
                     retval = send_require_port_data_to_file_manager(self, file_manager, address);
                  }
                  apx_server_release_global_lock(self->server);
               }
               else
               {
                  apx_nodeInstance_set_require_port_data_state(self, APX_DATA_STATE_CONNECTED);
                  retval = send_require_port_data_to_file_manager(self, file_manager, address);
               }
            }
            break;
         default:
            retval = APX_UNSUPPORTED_ERROR;
         }
         return retval;
      }
   }
   return APX_NULL_PTR_ERROR;
}